

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall
pbrt::ParsedScene::LookAt
          (ParsedScene *this,Float ex,Float ey,Float ez,Float lx,Float ly,Float lz,Float ux,Float uy
          ,Float uz,FileLoc loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Transform *pTVar3;
  int i;
  bool bVar4;
  Vector3f local_148;
  Point3f local_13c;
  Transform local_130;
  Transform local_b0;
  
  if (this->currentApiState == Uninitialized) {
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_130.m.m + 1);
    local_130.m.m[0][2] = 0.0;
    local_130.m.m[0][3] = 0.0;
    local_130.m.m[1][0]._0_1_ = '\0';
    local_130.m.m[0]._0_8_ = paVar1;
    detail::stringPrintfRecursive<char_const(&)[7]>
              ((string *)&local_130,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [7])"LookAt");
    Error(&loc,(char *)local_130.m.m[0]._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.m.m[0]._0_8_ != paVar1) {
      operator_delete((void *)local_130.m.m[0]._0_8_,
                      CONCAT71(local_130.m.m[1]._1_7_,local_130.m.m[1][0]._0_1_) + 1);
    }
  }
  else {
    local_148.super_Tuple3<pbrt::Vector3,_float>.z = uz;
    local_148.super_Tuple3<pbrt::Vector3,_float>.x = ux;
    local_148.super_Tuple3<pbrt::Vector3,_float>.y = uy;
    local_13c.super_Tuple3<pbrt::Point3,_float>.x = lx;
    local_13c.super_Tuple3<pbrt::Point3,_float>.y = ly;
    local_13c.super_Tuple3<pbrt::Point3,_float>.z = lz;
    local_b0.m.m[0][0] = ex;
    local_b0.m.m[0][1] = ey;
    local_b0.m.m[0][2] = ez;
    pbrt::LookAt(&local_130,(Point3f *)&local_b0,&local_13c,&local_148);
    i = 0;
    bVar2 = true;
    do {
      bVar4 = bVar2;
      if ((this->activeTransformBits >> i & 1) != 0) {
        pTVar3 = TransformSet::operator[](&this->curTransform,i);
        pbrt::Transform::operator*(&local_b0,pTVar3,&local_130);
        pTVar3 = TransformSet::operator[](&this->curTransform,i);
        *(ulong *)(pTVar3->m).m[0] = CONCAT44(local_b0.m.m[0][1],local_b0.m.m[0][0]);
        *(ulong *)((pTVar3->m).m[0] + 2) = CONCAT44(local_b0.m.m[0][3],local_b0.m.m[0][2]);
        *(undefined8 *)(pTVar3->m).m[1] = local_b0.m.m[1]._0_8_;
        *(undefined8 *)((pTVar3->m).m[1] + 2) = local_b0.m.m[1]._8_8_;
        *(undefined8 *)(pTVar3->m).m[2] = local_b0.m.m[2]._0_8_;
        *(undefined8 *)((pTVar3->m).m[2] + 2) = local_b0.m.m[2]._8_8_;
        *(undefined8 *)(pTVar3->m).m[3] = local_b0.m.m[3]._0_8_;
        *(undefined8 *)((pTVar3->m).m[3] + 2) = local_b0.m.m[3]._8_8_;
        *(undefined8 *)(pTVar3->mInv).m[0] = local_b0.mInv.m[0]._0_8_;
        *(undefined8 *)((pTVar3->mInv).m[0] + 2) = local_b0.mInv.m[0]._8_8_;
        *(undefined8 *)(pTVar3->mInv).m[1] = local_b0.mInv.m[1]._0_8_;
        *(undefined8 *)((pTVar3->mInv).m[1] + 2) = local_b0.mInv.m[1]._8_8_;
        *(undefined8 *)(pTVar3->mInv).m[2] = local_b0.mInv.m[2]._0_8_;
        *(undefined8 *)((pTVar3->mInv).m[2] + 2) = local_b0.mInv.m[2]._8_8_;
        *(undefined8 *)(pTVar3->mInv).m[3] = local_b0.mInv.m[3]._0_8_;
        *(undefined8 *)((pTVar3->mInv).m[3] + 2) = local_b0.mInv.m[3]._8_8_;
      }
      i = 1;
      bVar2 = false;
    } while (bVar4);
  }
  return;
}

Assistant:

void ParsedScene::LookAt(Float ex, Float ey, Float ez, Float lx, Float ly, Float lz,
                         Float ux, Float uy, Float uz, FileLoc loc) {
    VERIFY_INITIALIZED("LookAt");
    class Transform lookAt =
        pbrt::LookAt(Point3f(ex, ey, ez), Point3f(lx, ly, lz), Vector3f(ux, uy, uz));
    FOR_ACTIVE_TRANSFORMS(curTransform[i] = curTransform[i] * lookAt;);
}